

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O1

void ssh_reconfig(Backend *be,Conf *conf)

{
  BackendVtable *pBVar1;
  
  if ((Pinger *)be[0x1b].interactor != (Pinger *)0x0) {
    pinger_reconfig((Pinger *)be[0x1b].interactor,(Conf *)be[-2].vt,conf);
  }
  (**(code **)((be[0x19].vt)->init + 0x20))(be[0x19].vt,conf);
  conf_free((Conf *)be[-2].vt);
  pBVar1 = (BackendVtable *)conf_copy(conf);
  be[-2].vt = pBVar1;
  ssh_cache_conf_values((Ssh *)(be + -3));
  return;
}

Assistant:

static void ssh_reconfig(Backend *be, Conf *conf)
{
    Ssh *ssh = container_of(be, Ssh, backend);

    if (ssh->pinger)
        pinger_reconfig(ssh->pinger, ssh->conf, conf);

    ssh_ppl_reconfigure(ssh->base_layer, conf);

    conf_free(ssh->conf);
    ssh->conf = conf_copy(conf);
    ssh_cache_conf_values(ssh);
}